

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void drop_item_tail(tgestate_t *state,item_t item)

{
  room_t rVar1;
  itemstruct_t *itemstr_00;
  byte in_SIL;
  long in_RDI;
  mappos16_t *inpos;
  mappos8_t *outpos;
  room_t room;
  itemstruct_t *itemstr;
  
  itemstr_00 = (itemstruct_t *)(in_RDI + 0x226 + (ulong)in_SIL * 7);
  rVar1 = *(room_t *)(in_RDI + 0x120);
  itemstr_00->room_and_flags = rVar1;
  if (rVar1 == '\0') {
    scale_mappos_down((mappos16_t *)(in_RDI + 0x3e0),&itemstr_00->mappos);
    (itemstr_00->mappos).w = '\0';
    calc_exterior_item_isopos(itemstr_00);
  }
  else {
    (itemstr_00->mappos).u = (uint8_t)*(undefined2 *)(in_RDI + 0x3e0);
    (itemstr_00->mappos).v = (uint8_t)*(undefined2 *)(in_RDI + 0x3e2);
    (itemstr_00->mappos).w = '\x05';
    calc_interior_item_isopos(itemstr_00);
  }
  return;
}

Assistant:

void drop_item_tail(tgestate_t *state, item_t item)
{
  itemstruct_t *itemstr; /* was HL */
  room_t        room;    /* was A */
  mappos8_t    *outpos;  /* was DE */
  mappos16_t   *inpos;   /* was HL */

  assert(state != NULL);
  ASSERT_ITEM_VALID(item);

  itemstr = &state->item_structs[item];
  room = state->room_index;
  itemstr->room_and_flags = room; /* Set object's room index. */
  if (room == room_0_OUTDOORS)
  {
    /* Outdoors. */

    // TODO: Hoist common code.
    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    scale_mappos_down(inpos, outpos);
    outpos->w = 0;

    calc_exterior_item_isopos(itemstr);
  }
  else
  {
    /* $7BE4: Drop item, interior part. */

    outpos = &itemstr->mappos;
    inpos  = &state->vischars[0].mi.mappos;

    outpos->u = inpos->u; // note: narrowing
    outpos->v = inpos->v; // note: narrowing
    outpos->w = 5;

    calc_interior_item_isopos(itemstr);
  }
}